

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void __thiscall
cmDocumentation::SetSection(cmDocumentation *this,char *name,cmDocumentationSection *section)

{
  cmDocumentationSection *this_00;
  
  this_00 = SectionAtName(this,name);
  cmDocumentationSection::operator=(this_00,section);
  return;
}

Assistant:

void cmDocumentation::SetSection(const char* name,
                                 cmDocumentationSection section)
{
  this->SectionAtName(name) = std::move(section);
}